

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QDBusSignature>::eraseLast(QGenericArrayOps<QDBusSignature> *this)

{
  QArrayDataPointer<QDBusSignature> *in_RDI;
  
  QArrayDataPointer<QDBusSignature>::end(in_RDI);
  QDBusSignature::~QDBusSignature((QDBusSignature *)0x1dc538);
  in_RDI->size = in_RDI->size + -1;
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }